

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O0

void __thiscall
cmTestGenerator::GenerateScriptNoConfig(cmTestGenerator *this,ostream *os,Indent *indent)

{
  ostream *poVar1;
  string local_40;
  Indent *local_20;
  Indent *indent_local;
  ostream *os_local;
  cmTestGenerator *this_local;
  
  local_20 = indent;
  indent_local = (Indent *)os;
  os_local = (ostream *)this;
  poVar1 = ::operator<<(os,indent);
  poVar1 = std::operator<<(poVar1,"add_test(");
  cmTest::GetName_abi_cxx11_(&local_40,this->Test);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::operator<<(poVar1," NOT_AVAILABLE)\n");
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptNoConfig(std::ostream& os,
                                             Indent const& indent)
{
  os << indent << "add_test(" << this->Test->GetName() << " NOT_AVAILABLE)\n";
}